

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O2

bool EqualityHelper(Sexp *first,Sexp *second)

{
  Kind KVar1;
  bool bVar2;
  int iVar3;
  ContractFrame *in_RAX;
  Sexp *pSVar4;
  Sexp *pSVar5;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  
  local_28.protected_frame = in_RAX;
  ContractFrameProtector::ContractFrameProtector(&local_28,"EqualityHelper");
  ContractFrame::AddContract(local_28.protected_frame,NoGc);
  KVar1 = second->kind;
  if (first->kind == CONS) {
    if (KVar1 == CONS) {
      pSVar4 = Sexp::Car(first);
      pSVar5 = Sexp::Car(second);
      bVar2 = EqualityHelper(pSVar4,pSVar5);
      if (bVar2) {
        pSVar4 = Sexp::Cdr(first);
        pSVar5 = Sexp::Cdr(second);
        bVar2 = EqualityHelper(pSVar4,pSVar5);
        goto LAB_0011cb3d;
      }
    }
  }
  else if (KVar1 != CONS) {
    switch(first->kind) {
    case SYMBOL:
      if (KVar1 == SYMBOL) {
        bVar2 = (first->field_1).cons.car == (second->field_1).cons.car;
        goto LAB_0011cb3d;
      }
      break;
    case STRING:
      if (KVar1 == STRING) {
        iVar3 = strcmp((first->field_1).string_value,(second->field_1).string_value);
        bVar2 = iVar3 == 0;
        goto LAB_0011cb3d;
      }
      break;
    case FIXNUM:
      if (KVar1 == FIXNUM) {
        bVar2 = (bool)(-((second->field_1).fixnum_value == (first->field_1).fixnum_value) & 1);
        goto LAB_0011cb3d;
      }
      break;
    case BOOL:
      if (KVar1 == BOOL) {
        bVar2 = (first->field_1).bool_value == (second->field_1).bool_value;
        goto LAB_0011cb3d;
      }
    }
    if (first == second) {
      bVar2 = true;
      goto LAB_0011cb3d;
    }
  }
  bVar2 = false;
LAB_0011cb3d:
  ContractFrameProtector::~ContractFrameProtector(&local_28);
  return bVar2;
}

Assistant:

bool EqualityHelper(Sexp *first, Sexp *second) {
  CONTRACT { FORBID_GC; }